

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

QDeviceDiscovery * QDeviceDiscovery::create(QDeviceTypes types,QObject *parent)

{
  bool bVar1;
  QDebug *o;
  QObject *parent_00;
  QDeviceDiscovery *pQVar2;
  QDeviceDiscoveryUDev *in_RSI;
  long in_FS_OFFSET;
  udev *udev;
  QDeviceDiscovery *helper;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff60;
  int line;
  char *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  QDeviceDiscovery *udev_00;
  char local_80 [8];
  QDebug *in_stack_ffffffffffffff88;
  QFlagsStorage<QDeviceDiscovery::QDeviceType> in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  QFlagsStorage<QDeviceDiscovery::QDeviceType> in_stack_ffffffffffffffac;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28 [2];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcDD();
  anon_unknown.dwarf_b371e::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    line = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (!bVar1) break;
    anon_unknown.dwarf_b371e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x12b9ee);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58,
               (char *)0x12ba04);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)in_RSI,
                           (char *)CONCAT44(in_stack_ffffffffffffffac.i,in_stack_ffffffffffffffa8));
    QDebug::QDebug(&local_30,o);
    operator<<<QFlags<QDeviceDiscovery::QDeviceType>,_true>
              (in_stack_ffffffffffffff88,
               (QFlags<QDeviceDiscovery::QDeviceType>)in_stack_ffffffffffffff9c.i);
    QDebug::~QDebug(local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    local_10 = 0;
  }
  udev_00 = (QDeviceDiscovery *)0x0;
  parent_00 = (QObject *)udev_new();
  if (parent_00 == (QObject *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)udev_00,(char *)0x0,line,(char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning(local_80,"Failed to get udev library context");
  }
  else {
    pQVar2 = (QDeviceDiscovery *)operator_new(0x38);
    QDeviceDiscoveryUDev::QDeviceDiscoveryUDev
              (in_RSI,(QDeviceTypes)in_stack_ffffffffffffffac.i,(udev *)udev_00,parent_00);
    udev_00 = pQVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return udev_00;
  }
  __stack_chk_fail();
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}